

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O1

size_t ZSTD_initCStream_usingCDict_advanced
                 (ZSTD_CStream *zcs,ZSTD_CDict *cdict,ZSTD_frameParameters fParams,
                 unsigned_long_long pledgedSrcSize)

{
  zcs->streamStage = zcss_init;
  zcs->pledgedSrcSizePlusOne = pledgedSrcSize + 1;
  (zcs->requestedParams).fParams.contentSizeFlag = (int)fParams._0_8_;
  (zcs->requestedParams).fParams.checksumFlag = (int)((ulong)fParams._0_8_ >> 0x20);
  (zcs->requestedParams).fParams.noDictIDFlag = fParams.noDictIDFlag;
  ZSTD_clearAllDicts(zcs);
  zcs->cdict = cdict;
  return 0;
}

Assistant:

size_t ZSTD_initCStream_usingCDict_advanced(ZSTD_CStream* zcs,
                                            const ZSTD_CDict* cdict,
                                            ZSTD_frameParameters fParams,
                                            unsigned long long pledgedSrcSize)
{
    DEBUGLOG(4, "ZSTD_initCStream_usingCDict_advanced");
    FORWARD_IF_ERROR( ZSTD_CCtx_reset(zcs, ZSTD_reset_session_only) , "");
    FORWARD_IF_ERROR( ZSTD_CCtx_setPledgedSrcSize(zcs, pledgedSrcSize) , "");
    zcs->requestedParams.fParams = fParams;
    FORWARD_IF_ERROR( ZSTD_CCtx_refCDict(zcs, cdict) , "");
    return 0;
}